

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  float fVar3;
  undefined4 uVar4;
  RTCFilterFunctionN p_Var5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [32];
  float fVar13;
  byte bVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  int iVar20;
  AABBNodeMB4D *node1;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  Geometry *pGVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  Scene *pSVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  bool bVar42;
  bool bVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [64];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [64];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar102;
  float fVar105;
  float fVar106;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar107;
  float fVar108;
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar109 [64];
  undefined1 auVar113 [16];
  undefined1 auVar114 [64];
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_16e1;
  undefined1 local_16e0 [16];
  undefined8 local_16d0;
  float fStack_16c8;
  float fStack_16c4;
  undefined1 local_16c0 [16];
  undefined1 local_16b0 [16];
  size_t local_1698;
  RayK<8> *local_1690;
  Scene *local_1688;
  undefined1 local_1680 [16];
  undefined1 local_1670 [16];
  undefined1 local_1660 [16];
  undefined1 local_1650 [16];
  undefined1 local_1640 [16];
  undefined1 local_1630 [16];
  undefined1 local_1620 [16];
  undefined1 local_1610 [16];
  long local_15f8;
  ulong local_15f0;
  ulong *local_15e8;
  long local_15e0;
  ulong local_15d8;
  RTCFilterFunctionNArguments local_15d0;
  undefined1 local_15a0 [32];
  undefined1 local_1580 [16];
  undefined8 local_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  float local_1550;
  float fStack_154c;
  float fStack_1548;
  float fStack_1544;
  undefined1 local_1540 [16];
  undefined1 local_1530 [16];
  undefined1 *local_1520;
  undefined1 local_1510 [16];
  undefined1 local_1500 [16];
  undefined1 local_14f0 [16];
  undefined1 local_14e0 [16];
  undefined1 local_14d0 [16];
  undefined1 local_14c0 [16];
  undefined1 local_14b0 [16];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  float local_1460;
  float fStack_145c;
  float fStack_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float fStack_1448;
  float fStack_1444;
  float local_1440;
  float fStack_143c;
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  float fStack_1424;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float fStack_1404;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  RTCHitN local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined4 local_12c0;
  undefined4 uStack_12bc;
  undefined4 uStack_12b8;
  undefined4 uStack_12b4;
  undefined4 uStack_12b0;
  undefined4 uStack_12ac;
  undefined4 uStack_12a8;
  undefined4 uStack_12a4;
  undefined4 local_12a0;
  undefined4 uStack_129c;
  undefined4 uStack_1298;
  undefined4 uStack_1294;
  undefined4 uStack_1290;
  undefined4 uStack_128c;
  undefined4 uStack_1288;
  undefined4 uStack_1284;
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  uint local_1240;
  uint uStack_123c;
  uint uStack_1238;
  uint uStack_1234;
  uint uStack_1230;
  uint uStack_122c;
  uint uStack_1228;
  uint uStack_1224;
  uint local_1220;
  uint uStack_121c;
  uint uStack_1218;
  uint uStack_1214;
  uint uStack_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_15e8 = local_11f8;
  local_1200 = root.ptr;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar81 = ZEXT3264(CONCAT428(uVar2,CONCAT424(uVar2,CONCAT420(uVar2,CONCAT416(uVar2,CONCAT412(uVar2
                                                  ,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))))))));
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar89 = ZEXT3264(CONCAT428(uVar2,CONCAT424(uVar2,CONCAT420(uVar2,CONCAT416(uVar2,CONCAT412(uVar2
                                                  ,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))))))));
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar94 = ZEXT3264(CONCAT428(uVar2,CONCAT424(uVar2,CONCAT420(uVar2,CONCAT416(uVar2,CONCAT412(uVar2
                                                  ,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))))))));
  local_1420 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1440 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1460 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_13c0 = local_1420 * 0.99999964;
  local_13e0 = local_1440 * 0.99999964;
  local_1400 = local_1460 * 0.99999964;
  local_1420 = local_1420 * 1.0000004;
  local_1440 = local_1440 * 1.0000004;
  local_1460 = local_1460 * 1.0000004;
  local_15f0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_15d8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar39 = local_15f0 ^ 0x20;
  uVar41 = local_15d8 ^ 0x20;
  iVar20 = (tray->tnear).field_0.i[k];
  auVar109 = ZEXT3264(CONCAT428(iVar20,CONCAT424(iVar20,CONCAT420(iVar20,CONCAT416(iVar20,CONCAT412(
                                                  iVar20,CONCAT48(iVar20,CONCAT44(iVar20,iVar20)))))
                                                )));
  iVar20 = (tray->tfar).field_0.i[k];
  auVar114 = ZEXT3264(CONCAT428(iVar20,CONCAT424(iVar20,CONCAT420(iVar20,CONCAT416(iVar20,CONCAT412(
                                                  iVar20,CONCAT48(iVar20,CONCAT44(iVar20,iVar20)))))
                                                )));
  iVar20 = 1 << ((uint)k & 0x1f);
  auVar50._4_4_ = iVar20;
  auVar50._0_4_ = iVar20;
  auVar50._8_4_ = iVar20;
  auVar50._12_4_ = iVar20;
  auVar50._16_4_ = iVar20;
  auVar50._20_4_ = iVar20;
  auVar50._24_4_ = iVar20;
  auVar50._28_4_ = iVar20;
  auVar15 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar50 = vpand_avx2(auVar50,auVar15);
  local_1340 = vpcmpeqd_avx2(auVar50,auVar15);
  bVar43 = true;
  fStack_13bc = local_13c0;
  fStack_13b8 = local_13c0;
  fStack_13b4 = local_13c0;
  fStack_13b0 = local_13c0;
  fStack_13ac = local_13c0;
  fStack_13a8 = local_13c0;
  fStack_13a4 = local_13c0;
  fStack_13dc = local_13e0;
  fStack_13d8 = local_13e0;
  fStack_13d4 = local_13e0;
  fStack_13d0 = local_13e0;
  fStack_13cc = local_13e0;
  fStack_13c8 = local_13e0;
  fStack_13c4 = local_13e0;
  fStack_13fc = local_1400;
  fStack_13f8 = local_1400;
  fStack_13f4 = local_1400;
  fStack_13f0 = local_1400;
  fStack_13ec = local_1400;
  fStack_13e8 = local_1400;
  fStack_13e4 = local_1400;
  fStack_141c = local_1420;
  fStack_1418 = local_1420;
  fStack_1414 = local_1420;
  fStack_1410 = local_1420;
  fStack_140c = local_1420;
  fStack_1408 = local_1420;
  fStack_1404 = local_1420;
  fStack_143c = local_1440;
  fStack_1438 = local_1440;
  fStack_1434 = local_1440;
  fStack_1430 = local_1440;
  fStack_142c = local_1440;
  fStack_1428 = local_1440;
  fStack_1424 = local_1440;
  fStack_145c = local_1460;
  fStack_1458 = local_1460;
  fStack_1454 = local_1460;
  fStack_1450 = local_1460;
  fStack_144c = local_1460;
  fStack_1448 = local_1460;
  fStack_1444 = local_1460;
  do {
    uVar40 = local_15e8[-1];
    local_15e8 = local_15e8 + -1;
    while( true ) {
      local_1360 = auVar81._0_32_;
      local_1380 = auVar89._0_32_;
      local_13a0 = auVar94._0_32_;
      if ((uVar40 & 8) != 0) break;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar51._4_4_ = uVar2;
      auVar51._0_4_ = uVar2;
      auVar51._8_4_ = uVar2;
      auVar51._12_4_ = uVar2;
      auVar51._16_4_ = uVar2;
      auVar51._20_4_ = uVar2;
      auVar51._24_4_ = uVar2;
      auVar51._28_4_ = uVar2;
      uVar21 = uVar40 & 0xfffffffffffffff0;
      auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + local_15f0),auVar51,
                                *(undefined1 (*) [32])(uVar21 + 0x40 + local_15f0));
      auVar50 = vsubps_avx(ZEXT1632(auVar44),local_1360);
      auVar15._4_4_ = fStack_13bc * auVar50._4_4_;
      auVar15._0_4_ = local_13c0 * auVar50._0_4_;
      auVar15._8_4_ = fStack_13b8 * auVar50._8_4_;
      auVar15._12_4_ = fStack_13b4 * auVar50._12_4_;
      auVar15._16_4_ = fStack_13b0 * auVar50._16_4_;
      auVar15._20_4_ = fStack_13ac * auVar50._20_4_;
      auVar15._24_4_ = fStack_13a8 * auVar50._24_4_;
      auVar15._28_4_ = auVar50._28_4_;
      auVar50 = vmaxps_avx(auVar109._0_32_,auVar15);
      auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + local_15d8),auVar51,
                                *(undefined1 (*) [32])(uVar21 + 0x40 + local_15d8));
      auVar15 = vsubps_avx(ZEXT1632(auVar44),local_1380);
      auVar12._4_4_ = fStack_13dc * auVar15._4_4_;
      auVar12._0_4_ = local_13e0 * auVar15._0_4_;
      auVar12._8_4_ = fStack_13d8 * auVar15._8_4_;
      auVar12._12_4_ = fStack_13d4 * auVar15._12_4_;
      auVar12._16_4_ = fStack_13d0 * auVar15._16_4_;
      auVar12._20_4_ = fStack_13cc * auVar15._20_4_;
      auVar12._24_4_ = fStack_13c8 * auVar15._24_4_;
      auVar12._28_4_ = auVar15._28_4_;
      auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + uVar28),auVar51,
                                *(undefined1 (*) [32])(uVar21 + 0x40 + uVar28));
      auVar15 = vsubps_avx(ZEXT1632(auVar44),local_13a0);
      auVar16._4_4_ = fStack_13fc * auVar15._4_4_;
      auVar16._0_4_ = local_1400 * auVar15._0_4_;
      auVar16._8_4_ = fStack_13f8 * auVar15._8_4_;
      auVar16._12_4_ = fStack_13f4 * auVar15._12_4_;
      auVar16._16_4_ = fStack_13f0 * auVar15._16_4_;
      auVar16._20_4_ = fStack_13ec * auVar15._20_4_;
      auVar16._24_4_ = fStack_13e8 * auVar15._24_4_;
      auVar16._28_4_ = auVar15._28_4_;
      auVar15 = vmaxps_avx(auVar12,auVar16);
      auVar50 = vmaxps_avx(auVar50,auVar15);
      auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + uVar39),auVar51,
                                *(undefined1 (*) [32])(uVar21 + 0x40 + uVar39));
      auVar15 = vsubps_avx(ZEXT1632(auVar44),local_1360);
      auVar17._4_4_ = fStack_141c * auVar15._4_4_;
      auVar17._0_4_ = local_1420 * auVar15._0_4_;
      auVar17._8_4_ = fStack_1418 * auVar15._8_4_;
      auVar17._12_4_ = fStack_1414 * auVar15._12_4_;
      auVar17._16_4_ = fStack_1410 * auVar15._16_4_;
      auVar17._20_4_ = fStack_140c * auVar15._20_4_;
      auVar17._24_4_ = fStack_1408 * auVar15._24_4_;
      auVar17._28_4_ = auVar15._28_4_;
      auVar15 = vminps_avx(auVar114._0_32_,auVar17);
      auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + uVar41),auVar51,
                                *(undefined1 (*) [32])(uVar21 + 0x40 + uVar41));
      auVar12 = vsubps_avx(ZEXT1632(auVar44),local_1380);
      auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar21 + 0x100 + (uVar28 ^ 0x20)),auVar51,
                                *(undefined1 (*) [32])(uVar21 + 0x40 + (uVar28 ^ 0x20)));
      auVar18._4_4_ = fStack_143c * auVar12._4_4_;
      auVar18._0_4_ = local_1440 * auVar12._0_4_;
      auVar18._8_4_ = fStack_1438 * auVar12._8_4_;
      auVar18._12_4_ = fStack_1434 * auVar12._12_4_;
      auVar18._16_4_ = fStack_1430 * auVar12._16_4_;
      auVar18._20_4_ = fStack_142c * auVar12._20_4_;
      auVar18._24_4_ = fStack_1428 * auVar12._24_4_;
      auVar18._28_4_ = auVar12._28_4_;
      auVar12 = vsubps_avx(ZEXT1632(auVar44),local_13a0);
      auVar19._4_4_ = fStack_145c * auVar12._4_4_;
      auVar19._0_4_ = local_1460 * auVar12._0_4_;
      auVar19._8_4_ = fStack_1458 * auVar12._8_4_;
      auVar19._12_4_ = fStack_1454 * auVar12._12_4_;
      auVar19._16_4_ = fStack_1450 * auVar12._16_4_;
      auVar19._20_4_ = fStack_144c * auVar12._20_4_;
      auVar19._24_4_ = fStack_1448 * auVar12._24_4_;
      auVar19._28_4_ = auVar12._28_4_;
      auVar12 = vminps_avx(auVar18,auVar19);
      auVar15 = vminps_avx(auVar15,auVar12);
      auVar50 = vcmpps_avx(auVar50,auVar15,2);
      if (((uint)uVar40 & 7) == 6) {
        auVar15 = vcmpps_avx(*(undefined1 (*) [32])(uVar21 + 0x1c0),auVar51,2);
        auVar12 = vcmpps_avx(auVar51,*(undefined1 (*) [32])(uVar21 + 0x1e0),1);
        auVar15 = vandps_avx(auVar15,auVar12);
        auVar50 = vandps_avx(auVar15,auVar50);
        auVar44 = vpackssdw_avx(auVar50._0_16_,auVar50._16_16_);
      }
      else {
        auVar44 = vpackssdw_avx(auVar50._0_16_,auVar50._16_16_);
      }
      auVar44 = vpsllw_avx(auVar44,0xf);
      if ((((((((auVar44 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar44 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar44 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar44 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar44 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar44 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar44 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar44[0xf])
      goto LAB_0062f5ab;
      auVar44 = vpacksswb_avx(auVar44,auVar44);
      bVar14 = SUB161(auVar44 >> 7,0) & 1 | (SUB161(auVar44 >> 0xf,0) & 1) << 1 |
               (SUB161(auVar44 >> 0x17,0) & 1) << 2 | (SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
               (SUB161(auVar44 >> 0x27,0) & 1) << 4 | (SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
               (SUB161(auVar44 >> 0x37,0) & 1) << 6 | SUB161(auVar44 >> 0x3f,0) << 7;
      lVar26 = 0;
      for (uVar40 = (ulong)bVar14; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
        lVar26 = lVar26 + 1;
      }
      uVar40 = *(ulong *)(uVar21 + lVar26 * 8);
      uVar22 = bVar14 - 1 & (uint)bVar14;
      uVar23 = (ulong)uVar22;
      if (uVar22 != 0) {
        *local_15e8 = uVar40;
        lVar26 = 0;
        for (; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
          lVar26 = lVar26 + 1;
        }
        uVar22 = uVar22 - 1 & uVar22;
        uVar23 = (ulong)uVar22;
        bVar42 = uVar22 == 0;
        while( true ) {
          local_15e8 = local_15e8 + 1;
          uVar40 = *(ulong *)(uVar21 + lVar26 * 8);
          if (bVar42) break;
          *local_15e8 = uVar40;
          lVar26 = 0;
          for (uVar40 = uVar23; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
            lVar26 = lVar26 + 1;
          }
          uVar23 = uVar23 - 1 & uVar23;
          bVar42 = uVar23 == 0;
        }
      }
    }
    local_15f8 = (ulong)((uint)uVar40 & 0xf) - 8;
    if (local_15f8 != 0) {
      uVar40 = uVar40 & 0xfffffffffffffff0;
      local_15e0 = 0;
      local_1480 = auVar109._0_32_;
      local_14a0 = auVar114._0_32_;
      local_1698 = k;
      local_1690 = ray;
      do {
        lVar37 = local_15e0 * 0x50;
        pSVar36 = context->scene;
        pGVar27 = (pSVar36->geometries).items[*(uint *)(uVar40 + 0x30 + lVar37)].ptr;
        fVar3 = (pGVar27->time_range).lower;
        fVar3 = pGVar27->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar3) / ((pGVar27->time_range).upper - fVar3));
        auVar44 = vroundss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),9);
        auVar44 = vminss_avx(auVar44,ZEXT416((uint)(pGVar27->fnumTimeSegments + -1.0)));
        auVar53 = vmaxss_avx(ZEXT816(0),auVar44);
        lVar24 = (long)(int)auVar53._0_4_ * 0x38;
        uVar38 = (ulong)*(uint *)(uVar40 + 4 + lVar37);
        lVar26 = *(long *)(*(long *)&pGVar27[2].numPrimitives + lVar24);
        lVar24 = *(long *)(*(long *)&pGVar27[2].numPrimitives + 0x38 + lVar24);
        auVar44 = *(undefined1 (*) [16])(lVar26 + (ulong)*(uint *)(uVar40 + lVar37) * 4);
        uVar29 = (ulong)*(uint *)(uVar40 + 0x10 + lVar37);
        auVar84 = *(undefined1 (*) [16])(lVar26 + uVar29 * 4);
        uVar30 = (ulong)*(uint *)(uVar40 + 0x20 + lVar37);
        auVar66 = *(undefined1 (*) [16])(lVar26 + uVar30 * 4);
        auVar59 = *(undefined1 (*) [16])(lVar26 + uVar38 * 4);
        uVar31 = (ulong)*(uint *)(uVar40 + 0x14 + lVar37);
        auVar68 = *(undefined1 (*) [16])(lVar26 + uVar31 * 4);
        uVar32 = (ulong)*(uint *)(uVar40 + 0x24 + lVar37);
        auVar65 = *(undefined1 (*) [16])(lVar26 + uVar32 * 4);
        uVar33 = (ulong)*(uint *)(uVar40 + 8 + lVar37);
        auVar90 = *(undefined1 (*) [16])(lVar26 + uVar33 * 4);
        uVar21 = (ulong)*(uint *)(uVar40 + 0x18 + lVar37);
        auVar55 = *(undefined1 (*) [16])(lVar26 + uVar21 * 4);
        uVar34 = (ulong)*(uint *)(uVar40 + 0x28 + lVar37);
        auVar52 = *(undefined1 (*) [16])(lVar26 + uVar34 * 4);
        uVar35 = (ulong)*(uint *)(uVar40 + 0xc + lVar37);
        auVar71 = *(undefined1 (*) [16])(lVar26 + uVar35 * 4);
        uVar23 = (ulong)*(uint *)(uVar40 + 0x1c + lVar37);
        auVar54 = *(undefined1 (*) [16])(lVar26 + uVar23 * 4);
        uVar25 = (ulong)*(uint *)(uVar40 + 0x2c + lVar37);
        auVar45 = *(undefined1 (*) [16])(lVar26 + uVar25 * 4);
        auVar46 = *(undefined1 (*) [16])(lVar24 + (ulong)*(uint *)(uVar40 + lVar37) * 4);
        auVar47 = *(undefined1 (*) [16])(lVar24 + uVar29 * 4);
        fVar3 = fVar3 - auVar53._0_4_;
        auVar53 = vunpcklps_avx(auVar44,auVar90);
        auVar90 = vunpckhps_avx(auVar44,auVar90);
        auVar57 = vunpcklps_avx(auVar59,auVar71);
        auVar59 = vunpckhps_avx(auVar59,auVar71);
        auVar44 = *(undefined1 (*) [16])(lVar24 + uVar38 * 4);
        auVar58 = vunpcklps_avx(auVar90,auVar59);
        auVar60 = vunpcklps_avx(auVar53,auVar57);
        auVar90 = vunpckhps_avx(auVar53,auVar57);
        auVar71 = vunpcklps_avx(auVar84,auVar55);
        auVar59 = vunpckhps_avx(auVar84,auVar55);
        auVar55 = vunpcklps_avx(auVar68,auVar54);
        auVar68 = vunpckhps_avx(auVar68,auVar54);
        auVar84 = *(undefined1 (*) [16])(lVar24 + uVar33 * 4);
        auVar54 = vunpcklps_avx(auVar59,auVar68);
        auVar53 = vunpcklps_avx(auVar71,auVar55);
        auVar68 = vunpckhps_avx(auVar71,auVar55);
        auVar71 = vunpcklps_avx(auVar66,auVar52);
        auVar55 = vunpckhps_avx(auVar66,auVar52);
        auVar57 = vunpcklps_avx(auVar65,auVar45);
        auVar52 = vunpckhps_avx(auVar65,auVar45);
        auVar59 = *(undefined1 (*) [16])(lVar24 + uVar35 * 4);
        auVar45 = vunpcklps_avx(auVar55,auVar52);
        auVar66 = vunpcklps_avx(auVar71,auVar57);
        auVar55 = vunpckhps_avx(auVar71,auVar57);
        auVar52 = vunpcklps_avx(auVar46,auVar84);
        auVar84 = vunpckhps_avx(auVar46,auVar84);
        auVar71 = vunpcklps_avx(auVar44,auVar59);
        auVar59 = vunpckhps_avx(auVar44,auVar59);
        auVar44 = *(undefined1 (*) [16])(lVar24 + uVar21 * 4);
        auVar46 = vunpcklps_avx(auVar84,auVar59);
        auVar57 = vunpcklps_avx(auVar52,auVar71);
        auVar59 = vunpckhps_avx(auVar52,auVar71);
        auVar71 = vunpcklps_avx(auVar47,auVar44);
        auVar52 = vunpckhps_avx(auVar47,auVar44);
        auVar44 = *(undefined1 (*) [16])(lVar24 + uVar31 * 4);
        auVar84 = *(undefined1 (*) [16])(lVar24 + uVar23 * 4);
        auVar47 = vunpcklps_avx(auVar44,auVar84);
        auVar44 = vunpckhps_avx(auVar44,auVar84);
        auVar65 = vunpcklps_avx(auVar52,auVar44);
        auVar67 = vunpcklps_avx(auVar71,auVar47);
        auVar52 = vunpckhps_avx(auVar71,auVar47);
        auVar44 = *(undefined1 (*) [16])(lVar24 + uVar30 * 4);
        auVar84 = *(undefined1 (*) [16])(lVar24 + uVar34 * 4);
        auVar47 = vunpcklps_avx(auVar44,auVar84);
        auVar71 = vunpckhps_avx(auVar44,auVar84);
        auVar44 = *(undefined1 (*) [16])(lVar24 + uVar32 * 4);
        auVar84 = *(undefined1 (*) [16])(lVar24 + uVar25 * 4);
        auVar70 = vunpcklps_avx(auVar44,auVar84);
        auVar44 = vunpckhps_avx(auVar44,auVar84);
        auVar84 = vunpcklps_avx(auVar71,auVar44);
        auVar71 = vunpcklps_avx(auVar47,auVar70);
        auVar44 = vunpckhps_avx(auVar47,auVar70);
        fVar13 = 1.0 - fVar3;
        auVar101._4_4_ = fVar13;
        auVar101._0_4_ = fVar13;
        auVar101._8_4_ = fVar13;
        auVar101._12_4_ = fVar13;
        auVar95._0_4_ = fVar3 * auVar57._0_4_;
        auVar95._4_4_ = fVar3 * auVar57._4_4_;
        auVar95._8_4_ = fVar3 * auVar57._8_4_;
        auVar95._12_4_ = fVar3 * auVar57._12_4_;
        auVar47 = vfmadd231ps_fma(auVar95,auVar101,auVar60);
        auVar82._0_4_ = fVar3 * auVar59._0_4_;
        auVar82._4_4_ = fVar3 * auVar59._4_4_;
        auVar82._8_4_ = fVar3 * auVar59._8_4_;
        auVar82._12_4_ = fVar3 * auVar59._12_4_;
        auVar59 = vfmadd231ps_fma(auVar82,auVar101,auVar90);
        auVar90._0_4_ = fVar3 * auVar46._0_4_;
        auVar90._4_4_ = fVar3 * auVar46._4_4_;
        auVar90._8_4_ = fVar3 * auVar46._8_4_;
        auVar90._12_4_ = fVar3 * auVar46._12_4_;
        auVar90 = vfmadd231ps_fma(auVar90,auVar101,auVar58);
        auVar96._0_4_ = fVar3 * auVar67._0_4_;
        auVar96._4_4_ = fVar3 * auVar67._4_4_;
        auVar96._8_4_ = fVar3 * auVar67._8_4_;
        auVar96._12_4_ = fVar3 * auVar67._12_4_;
        auVar46 = vfmadd231ps_fma(auVar96,auVar101,auVar53);
        auVar70._0_4_ = fVar3 * auVar52._0_4_;
        auVar70._4_4_ = fVar3 * auVar52._4_4_;
        auVar70._8_4_ = fVar3 * auVar52._8_4_;
        auVar70._12_4_ = fVar3 * auVar52._12_4_;
        auVar68 = vfmadd231ps_fma(auVar70,auVar101,auVar68);
        puVar1 = (undefined8 *)(uVar40 + 0x30 + lVar37);
        local_1560 = *puVar1;
        uStack_1558 = puVar1[1];
        puVar1 = (undefined8 *)(uVar40 + 0x40 + lVar37);
        auVar52._0_4_ = fVar3 * auVar65._0_4_;
        auVar52._4_4_ = fVar3 * auVar65._4_4_;
        auVar52._8_4_ = fVar3 * auVar65._8_4_;
        auVar52._12_4_ = fVar3 * auVar65._12_4_;
        auVar52 = vfmadd231ps_fma(auVar52,auVar101,auVar54);
        auVar57._0_4_ = fVar3 * auVar71._0_4_;
        auVar57._4_4_ = fVar3 * auVar71._4_4_;
        auVar57._8_4_ = fVar3 * auVar71._8_4_;
        auVar57._12_4_ = fVar3 * auVar71._12_4_;
        auVar65._0_4_ = fVar3 * auVar44._0_4_;
        auVar65._4_4_ = fVar3 * auVar44._4_4_;
        auVar65._8_4_ = fVar3 * auVar44._8_4_;
        auVar65._12_4_ = fVar3 * auVar44._12_4_;
        auVar44._0_4_ = fVar3 * auVar84._0_4_;
        auVar44._4_4_ = fVar3 * auVar84._4_4_;
        auVar44._8_4_ = fVar3 * auVar84._8_4_;
        auVar44._12_4_ = fVar3 * auVar84._12_4_;
        auVar71 = vfmadd231ps_fma(auVar57,auVar101,auVar66);
        auVar55 = vfmadd231ps_fma(auVar65,auVar101,auVar55);
        auVar54 = vfmadd231ps_fma(auVar44,auVar101,auVar45);
        local_1570 = *puVar1;
        uStack_1568 = puVar1[1];
        uVar2 = *(undefined4 *)(local_1690 + local_1698 * 4);
        auVar45._4_4_ = uVar2;
        auVar45._0_4_ = uVar2;
        auVar45._8_4_ = uVar2;
        auVar45._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(local_1690 + local_1698 * 4 + 0x20);
        auVar100._4_4_ = uVar2;
        auVar100._0_4_ = uVar2;
        auVar100._8_4_ = uVar2;
        auVar100._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(local_1690 + local_1698 * 4 + 0x40);
        auVar103._4_4_ = uVar2;
        auVar103._0_4_ = uVar2;
        auVar103._8_4_ = uVar2;
        auVar103._12_4_ = uVar2;
        local_16b0 = vsubps_avx(auVar47,auVar45);
        local_16c0 = vsubps_avx(auVar59,auVar100);
        local_1610 = vsubps_avx(auVar90,auVar103);
        auVar44 = vsubps_avx(auVar46,auVar45);
        auVar84 = vsubps_avx(auVar68,auVar100);
        auVar59 = vsubps_avx(auVar52,auVar103);
        auVar68 = vsubps_avx(auVar71,auVar45);
        auVar90 = vsubps_avx(auVar55,auVar100);
        auVar55 = vsubps_avx(auVar54,auVar103);
        local_1660 = vsubps_avx(auVar68,local_16b0);
        auVar52 = vsubps_avx(auVar90,local_16c0);
        local_1670 = vsubps_avx(auVar55,local_1610);
        auVar46._0_4_ = local_16b0._0_4_ + auVar68._0_4_;
        auVar46._4_4_ = local_16b0._4_4_ + auVar68._4_4_;
        auVar46._8_4_ = local_16b0._8_4_ + auVar68._8_4_;
        auVar46._12_4_ = local_16b0._12_4_ + auVar68._12_4_;
        auVar66._0_4_ = auVar90._0_4_ + local_16c0._0_4_;
        auVar66._4_4_ = auVar90._4_4_ + local_16c0._4_4_;
        auVar66._8_4_ = auVar90._8_4_ + local_16c0._8_4_;
        auVar66._12_4_ = auVar90._12_4_ + local_16c0._12_4_;
        fVar3 = local_1610._0_4_;
        auVar71._0_4_ = auVar55._0_4_ + fVar3;
        fVar13 = local_1610._4_4_;
        auVar71._4_4_ = auVar55._4_4_ + fVar13;
        fVar6 = local_1610._8_4_;
        auVar71._8_4_ = auVar55._8_4_ + fVar6;
        fVar7 = local_1610._12_4_;
        auVar71._12_4_ = auVar55._12_4_ + fVar7;
        auVar104._0_4_ = local_1670._0_4_ * auVar66._0_4_;
        auVar104._4_4_ = local_1670._4_4_ * auVar66._4_4_;
        auVar104._8_4_ = local_1670._8_4_ * auVar66._8_4_;
        auVar104._12_4_ = local_1670._12_4_ * auVar66._12_4_;
        auVar54 = vfmsub231ps_fma(auVar104,auVar52,auVar71);
        auVar72._0_4_ = local_1660._0_4_ * auVar71._0_4_;
        auVar72._4_4_ = local_1660._4_4_ * auVar71._4_4_;
        auVar72._8_4_ = local_1660._8_4_ * auVar71._8_4_;
        auVar72._12_4_ = local_1660._12_4_ * auVar71._12_4_;
        auVar71 = vfmsub231ps_fma(auVar72,local_1670,auVar46);
        auVar47._0_4_ = auVar52._0_4_ * auVar46._0_4_;
        auVar47._4_4_ = auVar52._4_4_ * auVar46._4_4_;
        auVar47._8_4_ = auVar52._8_4_ * auVar46._8_4_;
        auVar47._12_4_ = auVar52._12_4_ * auVar46._12_4_;
        auVar45 = vfmsub231ps_fma(auVar47,local_1660,auVar66);
        local_16d0._4_4_ = *(float *)(local_1690 + local_1698 * 4 + 0xc0);
        auVar67._0_4_ = local_16d0._4_4_ * auVar45._0_4_;
        auVar67._4_4_ = local_16d0._4_4_ * auVar45._4_4_;
        auVar67._8_4_ = local_16d0._4_4_ * auVar45._8_4_;
        auVar67._12_4_ = local_16d0._4_4_ * auVar45._12_4_;
        uVar2 = *(undefined4 *)(local_1690 + local_1698 * 4 + 0xa0);
        auVar113._4_4_ = uVar2;
        auVar113._0_4_ = uVar2;
        auVar113._8_4_ = uVar2;
        auVar113._12_4_ = uVar2;
        auVar71 = vfmadd231ps_fma(auVar67,auVar113,auVar71);
        uVar2 = *(undefined4 *)(local_1690 + local_1698 * 4 + 0x80);
        auVar97._4_4_ = uVar2;
        auVar97._0_4_ = uVar2;
        auVar97._8_4_ = uVar2;
        auVar97._12_4_ = uVar2;
        local_1650 = vfmadd231ps_fma(auVar71,auVar97,auVar54);
        local_1620 = vsubps_avx(local_16c0,auVar84);
        local_1630 = vsubps_avx(local_1610,auVar59);
        auVar53._0_4_ = local_16c0._0_4_ + auVar84._0_4_;
        auVar53._4_4_ = local_16c0._4_4_ + auVar84._4_4_;
        auVar53._8_4_ = local_16c0._8_4_ + auVar84._8_4_;
        auVar53._12_4_ = local_16c0._12_4_ + auVar84._12_4_;
        auVar73._0_4_ = auVar59._0_4_ + fVar3;
        auVar73._4_4_ = auVar59._4_4_ + fVar13;
        auVar73._8_4_ = auVar59._8_4_ + fVar6;
        auVar73._12_4_ = auVar59._12_4_ + fVar7;
        fVar8 = local_1630._0_4_;
        auVar83._0_4_ = auVar53._0_4_ * fVar8;
        fVar9 = local_1630._4_4_;
        auVar83._4_4_ = auVar53._4_4_ * fVar9;
        fVar10 = local_1630._8_4_;
        auVar83._8_4_ = auVar53._8_4_ * fVar10;
        fVar11 = local_1630._12_4_;
        auVar83._12_4_ = auVar53._12_4_ * fVar11;
        auVar54 = vfmsub231ps_fma(auVar83,local_1620,auVar73);
        local_1640 = vsubps_avx(local_16b0,auVar44);
        fVar102 = local_1640._0_4_;
        auVar91._0_4_ = fVar102 * auVar73._0_4_;
        fVar105 = local_1640._4_4_;
        auVar91._4_4_ = fVar105 * auVar73._4_4_;
        fVar106 = local_1640._8_4_;
        auVar91._8_4_ = fVar106 * auVar73._8_4_;
        fVar107 = local_1640._12_4_;
        auVar91._12_4_ = fVar107 * auVar73._12_4_;
        auVar74._0_4_ = local_16b0._0_4_ + auVar44._0_4_;
        auVar74._4_4_ = local_16b0._4_4_ + auVar44._4_4_;
        auVar74._8_4_ = local_16b0._8_4_ + auVar44._8_4_;
        auVar74._12_4_ = local_16b0._12_4_ + auVar44._12_4_;
        auVar71 = vfmsub231ps_fma(auVar91,local_1630,auVar74);
        fVar108 = local_1620._0_4_;
        auVar75._0_4_ = fVar108 * auVar74._0_4_;
        fVar110 = local_1620._4_4_;
        auVar75._4_4_ = fVar110 * auVar74._4_4_;
        fVar111 = local_1620._8_4_;
        auVar75._8_4_ = fVar111 * auVar74._8_4_;
        fVar112 = local_1620._12_4_;
        auVar75._12_4_ = fVar112 * auVar74._12_4_;
        auVar45 = vfmsub231ps_fma(auVar75,local_1640,auVar53);
        auVar76._0_4_ = local_16d0._4_4_ * auVar45._0_4_;
        auVar76._4_4_ = local_16d0._4_4_ * auVar45._4_4_;
        auVar76._8_4_ = local_16d0._4_4_ * auVar45._8_4_;
        auVar76._12_4_ = local_16d0._4_4_ * auVar45._12_4_;
        auVar71 = vfmadd231ps_fma(auVar76,auVar113,auVar71);
        local_1540 = vfmadd231ps_fma(auVar71,auVar97,auVar54);
        auVar71 = vsubps_avx(auVar44,auVar68);
        auVar58._0_4_ = auVar44._0_4_ + auVar68._0_4_;
        auVar58._4_4_ = auVar44._4_4_ + auVar68._4_4_;
        auVar58._8_4_ = auVar44._8_4_ + auVar68._8_4_;
        auVar58._12_4_ = auVar44._12_4_ + auVar68._12_4_;
        auVar68 = vsubps_avx(auVar84,auVar90);
        auVar54._0_4_ = auVar90._0_4_ + auVar84._0_4_;
        auVar54._4_4_ = auVar90._4_4_ + auVar84._4_4_;
        auVar54._8_4_ = auVar90._8_4_ + auVar84._8_4_;
        auVar54._12_4_ = auVar90._12_4_ + auVar84._12_4_;
        auVar90 = vsubps_avx(auVar59,auVar55);
        auVar77._0_4_ = auVar59._0_4_ + auVar55._0_4_;
        auVar77._4_4_ = auVar59._4_4_ + auVar55._4_4_;
        auVar77._8_4_ = auVar59._8_4_ + auVar55._8_4_;
        auVar77._12_4_ = auVar59._12_4_ + auVar55._12_4_;
        auVar84._0_4_ = auVar90._0_4_ * auVar54._0_4_;
        auVar84._4_4_ = auVar90._4_4_ * auVar54._4_4_;
        auVar84._8_4_ = auVar90._8_4_ * auVar54._8_4_;
        auVar84._12_4_ = auVar90._12_4_ * auVar54._12_4_;
        auVar84 = vfmsub231ps_fma(auVar84,auVar68,auVar77);
        auVar78._0_4_ = auVar77._0_4_ * auVar71._0_4_;
        auVar78._4_4_ = auVar77._4_4_ * auVar71._4_4_;
        auVar78._8_4_ = auVar77._8_4_ * auVar71._8_4_;
        auVar78._12_4_ = auVar77._12_4_ * auVar71._12_4_;
        auVar44 = vfmsub231ps_fma(auVar78,auVar90,auVar58);
        auVar59._0_4_ = auVar68._0_4_ * auVar58._0_4_;
        auVar59._4_4_ = auVar68._4_4_ * auVar58._4_4_;
        auVar59._8_4_ = auVar68._8_4_ * auVar58._8_4_;
        auVar59._12_4_ = auVar68._12_4_ * auVar58._12_4_;
        auVar59 = vfmsub231ps_fma(auVar59,auVar71,auVar54);
        local_16d0._0_4_ = local_16d0._4_4_;
        fStack_16c8 = local_16d0._4_4_;
        fStack_16c4 = local_16d0._4_4_;
        auVar60._0_4_ = local_16d0._4_4_ * auVar59._0_4_;
        auVar60._4_4_ = local_16d0._4_4_ * auVar59._4_4_;
        auVar60._8_4_ = local_16d0._4_4_ * auVar59._8_4_;
        auVar60._12_4_ = local_16d0._4_4_ * auVar59._12_4_;
        auVar44 = vfmadd231ps_fma(auVar60,auVar113,auVar44);
        auVar59 = vfmadd231ps_fma(auVar44,auVar97,auVar84);
        local_1550 = local_1650._0_4_;
        fStack_154c = local_1650._4_4_;
        fStack_1548 = local_1650._8_4_;
        fStack_1544 = local_1650._12_4_;
        local_1530._0_4_ = auVar59._0_4_ + local_1550 + local_1540._0_4_;
        local_1530._4_4_ = auVar59._4_4_ + fStack_154c + local_1540._4_4_;
        local_1530._8_4_ = auVar59._8_4_ + fStack_1548 + local_1540._8_4_;
        local_1530._12_4_ = auVar59._12_4_ + fStack_1544 + local_1540._12_4_;
        auVar55._8_4_ = 0x7fffffff;
        auVar55._0_8_ = 0x7fffffff7fffffff;
        auVar55._12_4_ = 0x7fffffff;
        auVar44 = vminps_avx(local_1650,local_1540);
        auVar44 = vminps_avx(auVar44,auVar59);
        local_1580 = vandps_avx(local_1530,auVar55);
        auVar92._0_4_ = local_1580._0_4_ * 1.1920929e-07;
        auVar92._4_4_ = local_1580._4_4_ * 1.1920929e-07;
        auVar92._8_4_ = local_1580._8_4_ * 1.1920929e-07;
        auVar92._12_4_ = local_1580._12_4_ * 1.1920929e-07;
        uVar21 = CONCAT44(auVar92._4_4_,auVar92._0_4_);
        auVar85._0_8_ = uVar21 ^ 0x8000000080000000;
        auVar85._8_4_ = -auVar92._8_4_;
        auVar85._12_4_ = -auVar92._12_4_;
        auVar44 = vcmpps_avx(auVar44,auVar85,5);
        auVar84 = vmaxps_avx(local_1650,local_1540);
        auVar84 = vmaxps_avx(auVar84,auVar59);
        auVar84 = vcmpps_avx(auVar84,auVar92,2);
        local_1680 = vorps_avx(auVar44,auVar84);
        k = local_1698;
        ray = local_1690;
        if ((((local_1680 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (local_1680 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (local_1680 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            local_1680[0xf] < '\0') {
          auVar61._0_4_ = fVar108 * local_1670._0_4_;
          auVar61._4_4_ = fVar110 * local_1670._4_4_;
          auVar61._8_4_ = fVar111 * local_1670._8_4_;
          auVar61._12_4_ = fVar112 * local_1670._12_4_;
          auVar79._0_4_ = auVar52._0_4_ * fVar102;
          auVar79._4_4_ = auVar52._4_4_ * fVar105;
          auVar79._8_4_ = auVar52._8_4_ * fVar106;
          auVar79._12_4_ = auVar52._12_4_ * fVar107;
          auVar59 = vfmsub213ps_fma(auVar52,local_1630,auVar61);
          auVar86._0_4_ = auVar68._0_4_ * fVar8;
          auVar86._4_4_ = auVar68._4_4_ * fVar9;
          auVar86._8_4_ = auVar68._8_4_ * fVar10;
          auVar86._12_4_ = auVar68._12_4_ * fVar11;
          auVar93._0_4_ = auVar90._0_4_ * fVar102;
          auVar93._4_4_ = auVar90._4_4_ * fVar105;
          auVar93._8_4_ = auVar90._8_4_ * fVar106;
          auVar93._12_4_ = auVar90._12_4_ * fVar107;
          auVar90 = vfmsub213ps_fma(auVar90,local_1620,auVar86);
          auVar44 = vandps_avx(auVar61,auVar55);
          auVar84 = vandps_avx(auVar86,auVar55);
          auVar44 = vcmpps_avx(auVar44,auVar84,1);
          local_14d0 = vblendvps_avx(auVar90,auVar59,auVar44);
          auVar87._0_4_ = fVar108 * auVar71._0_4_;
          auVar87._4_4_ = fVar110 * auVar71._4_4_;
          auVar87._8_4_ = fVar111 * auVar71._8_4_;
          auVar87._12_4_ = fVar112 * auVar71._12_4_;
          auVar59 = vfmsub213ps_fma(auVar71,local_1630,auVar93);
          auVar62._0_4_ = local_1660._0_4_ * fVar8;
          auVar62._4_4_ = local_1660._4_4_ * fVar9;
          auVar62._8_4_ = local_1660._8_4_ * fVar10;
          auVar62._12_4_ = local_1660._12_4_ * fVar11;
          auVar90 = vfmsub213ps_fma(local_1670,local_1640,auVar62);
          auVar44 = vandps_avx(auVar62,auVar55);
          auVar84 = vandps_avx(auVar93,auVar55);
          auVar44 = vcmpps_avx(auVar44,auVar84,1);
          local_14c0 = vblendvps_avx(auVar59,auVar90,auVar44);
          auVar59 = vfmsub213ps_fma(local_1660,local_1620,auVar79);
          auVar68 = vfmsub213ps_fma(auVar68,local_1640,auVar87);
          auVar44 = vandps_avx(auVar79,auVar55);
          auVar84 = vandps_avx(auVar87,auVar55);
          auVar44 = vcmpps_avx(auVar44,auVar84,1);
          local_14b0 = vblendvps_avx(auVar68,auVar59,auVar44);
          auVar68._0_4_ = local_14b0._0_4_ * local_16d0._4_4_;
          auVar68._4_4_ = local_14b0._4_4_ * local_16d0._4_4_;
          auVar68._8_4_ = local_14b0._8_4_ * local_16d0._4_4_;
          auVar68._12_4_ = local_14b0._12_4_ * local_16d0._4_4_;
          auVar44 = vfmadd213ps_fma(auVar113,local_14c0,auVar68);
          auVar44 = vfmadd213ps_fma(auVar97,local_14d0,auVar44);
          auVar80._0_4_ = auVar44._0_4_ + auVar44._0_4_;
          auVar80._4_4_ = auVar44._4_4_ + auVar44._4_4_;
          auVar80._8_4_ = auVar44._8_4_ + auVar44._8_4_;
          auVar80._12_4_ = auVar44._12_4_ + auVar44._12_4_;
          auVar69._0_4_ = local_14b0._0_4_ * fVar3;
          auVar69._4_4_ = local_14b0._4_4_ * fVar13;
          auVar69._8_4_ = local_14b0._8_4_ * fVar6;
          auVar69._12_4_ = local_14b0._12_4_ * fVar7;
          auVar44 = vfmadd213ps_fma(local_16c0,local_14c0,auVar69);
          auVar84 = vfmadd213ps_fma(local_16b0,local_14d0,auVar44);
          auVar44 = vrcpps_avx(auVar80);
          auVar98._8_4_ = 0x3f800000;
          auVar98._0_8_ = 0x3f8000003f800000;
          auVar98._12_4_ = 0x3f800000;
          auVar59 = vfnmadd213ps_fma(auVar44,auVar80,auVar98);
          auVar44 = vfmadd132ps_fma(auVar59,auVar44,auVar44);
          local_14e0._0_4_ = (auVar84._0_4_ + auVar84._0_4_) * auVar44._0_4_;
          local_14e0._4_4_ = (auVar84._4_4_ + auVar84._4_4_) * auVar44._4_4_;
          local_14e0._8_4_ = (auVar84._8_4_ + auVar84._8_4_) * auVar44._8_4_;
          local_14e0._12_4_ = (auVar84._12_4_ + auVar84._12_4_) * auVar44._12_4_;
          uVar2 = *(undefined4 *)(local_1690 + local_1698 * 4 + 0x60);
          auVar88._4_4_ = uVar2;
          auVar88._0_4_ = uVar2;
          auVar88._8_4_ = uVar2;
          auVar88._12_4_ = uVar2;
          auVar44 = vcmpps_avx(auVar88,local_14e0,2);
          uVar2 = *(undefined4 *)(local_1690 + local_1698 * 4 + 0x100);
          auVar99._4_4_ = uVar2;
          auVar99._0_4_ = uVar2;
          auVar99._8_4_ = uVar2;
          auVar99._12_4_ = uVar2;
          auVar81 = ZEXT1664(auVar99);
          auVar84 = vcmpps_avx(local_14e0,auVar99,2);
          auVar44 = vandps_avx(auVar44,auVar84);
          auVar84 = local_1680 & auVar44;
          if ((((auVar84 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar84 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar84 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar84[0xf] < '\0') {
            auVar44 = vandps_avx(auVar44,local_1680);
            auVar84 = vcmpps_avx(auVar80,_DAT_01f7aa10,4);
            local_1510 = vandps_avx(auVar44,auVar84);
            uVar22 = vmovmskps_avx(local_1510);
            if (uVar22 != 0) {
              local_1520 = &local_16e1;
              auVar44 = vrcpps_avx(local_1530);
              auVar63._8_4_ = 0x3f800000;
              auVar63._0_8_ = 0x3f8000003f800000;
              auVar63._12_4_ = 0x3f800000;
              auVar84 = vfnmadd213ps_fma(local_1530,auVar44,auVar63);
              auVar84 = vfmadd132ps_fma(auVar84,auVar44,auVar44);
              auVar56._8_4_ = 0x219392ef;
              auVar56._0_8_ = 0x219392ef219392ef;
              auVar56._12_4_ = 0x219392ef;
              auVar44 = vcmpps_avx(local_1580,auVar56,5);
              auVar44 = vandps_avx(auVar84,auVar44);
              auVar48._0_4_ = local_1550 * auVar44._0_4_;
              auVar48._4_4_ = fStack_154c * auVar44._4_4_;
              auVar48._8_4_ = fStack_1548 * auVar44._8_4_;
              auVar48._12_4_ = fStack_1544 * auVar44._12_4_;
              local_1500 = vminps_avx(auVar48,auVar63);
              auVar49._0_4_ = auVar44._0_4_ * local_1540._0_4_;
              auVar49._4_4_ = auVar44._4_4_ * local_1540._4_4_;
              auVar49._8_4_ = auVar44._8_4_ * local_1540._8_4_;
              auVar49._12_4_ = auVar44._12_4_ * local_1540._12_4_;
              local_14f0 = vminps_avx(auVar49,auVar63);
              uVar21 = (ulong)(uVar22 & 0xff);
              local_1688 = pSVar36;
              do {
                uVar23 = 0;
                for (uVar25 = uVar21; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000)
                {
                  uVar23 = uVar23 + 1;
                }
                uVar22 = *(uint *)((long)&local_1560 + uVar23 * 4);
                pGVar27 = (pSVar36->geometries).items[uVar22].ptr;
                if ((pGVar27->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  uVar21 = uVar21 ^ 1L << (uVar23 & 0x3f);
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar27->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0062f5c1:
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                    return bVar43;
                  }
                  uVar25 = (ulong)(uint)((int)uVar23 * 4);
                  local_12c0 = *(undefined4 *)(local_1500 + uVar25);
                  local_12a0 = *(undefined4 *)(local_14f0 + uVar25);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_14e0 + uVar25);
                  local_16d0 = pGVar27;
                  local_15d0.context = context->user;
                  uVar2 = *(undefined4 *)((long)&local_1570 + uVar25);
                  local_1280._4_4_ = uVar2;
                  local_1280._0_4_ = uVar2;
                  local_1280._8_4_ = uVar2;
                  local_1280._12_4_ = uVar2;
                  local_1280._16_4_ = uVar2;
                  local_1280._20_4_ = uVar2;
                  local_1280._24_4_ = uVar2;
                  local_1280._28_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_14d0 + uVar25);
                  uVar4 = *(undefined4 *)(local_14c0 + uVar25);
                  local_1300._4_4_ = uVar4;
                  local_1300._0_4_ = uVar4;
                  local_1300._8_4_ = uVar4;
                  local_1300._12_4_ = uVar4;
                  local_1300._16_4_ = uVar4;
                  local_1300._20_4_ = uVar4;
                  local_1300._24_4_ = uVar4;
                  local_1300._28_4_ = uVar4;
                  uVar4 = *(undefined4 *)(local_14b0 + uVar25);
                  local_12e0._4_4_ = uVar4;
                  local_12e0._0_4_ = uVar4;
                  local_12e0._8_4_ = uVar4;
                  local_12e0._12_4_ = uVar4;
                  local_12e0._16_4_ = uVar4;
                  local_12e0._20_4_ = uVar4;
                  local_12e0._24_4_ = uVar4;
                  local_12e0._28_4_ = uVar4;
                  local_1260._4_4_ = uVar22;
                  local_1260._0_4_ = uVar22;
                  local_1260._8_4_ = uVar22;
                  local_1260._12_4_ = uVar22;
                  local_1260._16_4_ = uVar22;
                  local_1260._20_4_ = uVar22;
                  local_1260._24_4_ = uVar22;
                  local_1260._28_4_ = uVar22;
                  local_1320[0] = (RTCHitN)(char)uVar2;
                  local_1320[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_1320[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_1320[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_1320[4] = (RTCHitN)(char)uVar2;
                  local_1320[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_1320[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_1320[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_1320[8] = (RTCHitN)(char)uVar2;
                  local_1320[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_1320[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_1320[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_1320[0xc] = (RTCHitN)(char)uVar2;
                  local_1320[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_1320[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_1320[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_1320[0x10] = (RTCHitN)(char)uVar2;
                  local_1320[0x11] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_1320[0x12] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_1320[0x13] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_1320[0x14] = (RTCHitN)(char)uVar2;
                  local_1320[0x15] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_1320[0x16] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_1320[0x17] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_1320[0x18] = (RTCHitN)(char)uVar2;
                  local_1320[0x19] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_1320[0x1a] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_1320[0x1b] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_1320[0x1c] = (RTCHitN)(char)uVar2;
                  local_1320[0x1d] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_1320[0x1e] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_1320[0x1f] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  uStack_12bc = local_12c0;
                  uStack_12b8 = local_12c0;
                  uStack_12b4 = local_12c0;
                  uStack_12b0 = local_12c0;
                  uStack_12ac = local_12c0;
                  uStack_12a8 = local_12c0;
                  uStack_12a4 = local_12c0;
                  uStack_129c = local_12a0;
                  uStack_1298 = local_12a0;
                  uStack_1294 = local_12a0;
                  uStack_1290 = local_12a0;
                  uStack_128c = local_12a0;
                  uStack_1288 = local_12a0;
                  uStack_1284 = local_12a0;
                  auVar50 = vpcmpeqd_avx2(local_1260,local_1260);
                  uStack_123c = (local_15d0.context)->instID[0];
                  local_1240 = uStack_123c;
                  uStack_1238 = uStack_123c;
                  uStack_1234 = uStack_123c;
                  uStack_1230 = uStack_123c;
                  uStack_122c = uStack_123c;
                  uStack_1228 = uStack_123c;
                  uStack_1224 = uStack_123c;
                  uStack_121c = (local_15d0.context)->instPrimID[0];
                  local_1220 = uStack_121c;
                  uStack_1218 = uStack_121c;
                  uStack_1214 = uStack_121c;
                  uStack_1210 = uStack_121c;
                  uStack_120c = uStack_121c;
                  uStack_1208 = uStack_121c;
                  uStack_1204 = uStack_121c;
                  local_15a0 = local_1340;
                  local_15d0.valid = (int *)local_15a0;
                  local_15d0.geometryUserPtr = pGVar27->userPtr;
                  local_15d0.hit = local_1320;
                  local_15d0.N = 8;
                  local_15d0.ray = (RTCRayN *)ray;
                  if (pGVar27->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    local_16e0 = auVar81._0_16_;
                    local_16b0._0_8_ = uVar21;
                    local_16c0._0_8_ = uVar23;
                    auVar50 = ZEXT1632(auVar50._0_16_);
                    (*pGVar27->occlusionFilterN)(&local_15d0);
                    auVar81 = ZEXT1664(local_16e0);
                    auVar50 = vpcmpeqd_avx2(auVar50,auVar50);
                    pGVar27 = local_16d0;
                    k = local_1698;
                    pSVar36 = local_1688;
                    ray = local_1690;
                    uVar21 = local_16b0._0_8_;
                    uVar23 = local_16c0._0_8_;
                  }
                  auVar12 = vpcmpeqd_avx2(local_15a0,_DAT_01faff00);
                  auVar15 = auVar50 & ~auVar12;
                  if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar15 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar15 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar15 >> 0x7f,0) == '\0') &&
                        (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar15 >> 0xbf,0) == '\0') &&
                      (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar15[0x1f]) {
                    auVar12 = auVar12 ^ auVar50;
                  }
                  else {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar27->field_8).field_0x2 & 0x40) != 0)))) {
                      local_16e0 = auVar81._0_16_;
                      local_16b0._0_8_ = uVar21;
                      local_16c0._0_8_ = uVar23;
                      auVar50 = ZEXT1632(auVar50._0_16_);
                      (*p_Var5)(&local_15d0);
                      auVar81 = ZEXT1664(local_16e0);
                      auVar50 = vpcmpeqd_avx2(auVar50,auVar50);
                      k = local_1698;
                      pSVar36 = local_1688;
                      ray = local_1690;
                      uVar21 = local_16b0._0_8_;
                      uVar23 = local_16c0._0_8_;
                    }
                    auVar15 = vpcmpeqd_avx2(local_15a0,_DAT_01faff00);
                    auVar12 = auVar15 ^ auVar50;
                    auVar64._8_4_ = 0xff800000;
                    auVar64._0_8_ = 0xff800000ff800000;
                    auVar64._12_4_ = 0xff800000;
                    auVar64._16_4_ = 0xff800000;
                    auVar64._20_4_ = 0xff800000;
                    auVar64._24_4_ = 0xff800000;
                    auVar64._28_4_ = 0xff800000;
                    auVar50 = vblendvps_avx(auVar64,*(undefined1 (*) [32])(local_15d0.ray + 0x100),
                                            auVar15);
                    *(undefined1 (*) [32])(local_15d0.ray + 0x100) = auVar50;
                  }
                  if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar12 >> 0x7f,0) != '\0') ||
                        (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar12 >> 0xbf,0) != '\0') ||
                      (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar12[0x1f] < '\0') goto LAB_0062f5c1;
                  *(int *)(ray + k * 4 + 0x100) = auVar81._0_4_;
                  uVar21 = uVar21 ^ 1L << (uVar23 & 0x3f);
                }
              } while (uVar21 != 0);
            }
          }
        }
        local_15e0 = local_15e0 + 1;
        auVar81 = ZEXT3264(local_1360);
        auVar89 = ZEXT3264(local_1380);
        auVar94 = ZEXT3264(local_13a0);
        auVar109 = ZEXT3264(local_1480);
        auVar114 = ZEXT3264(local_14a0);
      } while (local_15e0 != local_15f8);
    }
LAB_0062f5ab:
    bVar43 = local_15e8 != &local_1200;
    if (!bVar43) {
      return bVar43;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }